

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O2

int glu::getNumStencilBits(TextureFormat *format)

{
  TextureFormat stencilOnlyFormat;
  int local_18 [4];
  
  if (format->order != S) {
    if (format->order != DS) {
      return 0;
    }
    stencilOnlyFormat = tcu::getEffectiveDepthStencilTextureFormat(format,MODE_STENCIL);
    format = &stencilOnlyFormat;
  }
  tcu::getTextureFormatBitDepth((tcu *)local_18,format);
  return local_18[0];
}

Assistant:

static int getNumStencilBits (const tcu::TextureFormat& format)
{
	if (format.order == tcu::TextureFormat::DS)
	{
		const tcu::TextureFormat	stencilOnlyFormat		= tcu::getEffectiveDepthStencilTextureFormat(format, tcu::Sampler::MODE_STENCIL);
		return tcu::getTextureFormatBitDepth(stencilOnlyFormat).x();
	}
	else if (format.order == tcu::TextureFormat::S)
		return tcu::getTextureFormatBitDepth(format).x();
	else
		return 0;
}